

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

Scalar cnn::logdet<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                 (Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *M,
                 bool use_cholesky)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  DenseCoeffsBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0> *this;
  PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *this_00;
  Index IVar4;
  CoeffReturnType pfVar5;
  undefined7 in_register_00000031;
  ulong uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  Scalar __x;
  float fVar9;
  undefined1 auVar10 [12];
  undefined1 in_ZMM0 [64];
  PartialPivLU<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> lu;
  float local_7c;
  undefined1 local_78 [16];
  MatrixTypeNested local_60;
  PartialPivLU<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> local_58;
  
  auVar10 = in_ZMM0._4_12_;
  if ((int)CONCAT71(in_register_00000031,use_cholesky) == 0) {
    Eigen::PartialPivLU<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
    PartialPivLU<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
              ((PartialPivLU<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_58,
               (EigenBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                *)M);
    this = (DenseCoeffsBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0> *)
           Eigen::PartialPivLU<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::matrixLU(&local_58);
    this_00 = (PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)
              Eigen::PartialPivLU<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::permutationP(&local_58)
    ;
    IVar4 = Eigen::PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::determinant(this_00);
    local_78._0_4_ = (undefined4)IVar4;
    local_78._4_12_ = auVar10;
    local_7c = 0.0;
    for (uVar7 = 0; uVar6 = (ulong)uVar7, (long)uVar6 < *(long *)(this + 8); uVar7 = uVar7 + 1) {
      pfVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         (this,uVar6,uVar6);
      uVar1 = vcmpss_avx512f(ZEXT416((uint)*pfVar5),ZEXT416(0),1);
      bVar2 = (bool)((byte)uVar1 & 1);
      auVar8._8_4_ = 0x80000000;
      auVar8._0_8_ = 0x8000000080000000;
      auVar8._12_4_ = 0x80000000;
      auVar8 = vxorps_avx512vl(local_78,auVar8);
      local_78._0_4_ = (uint)bVar2 * auVar8._0_4_ + (uint)!bVar2 * local_78._0_4_;
      auVar3._8_4_ = 0x7fffffff;
      auVar3._0_8_ = 0x7fffffff7fffffff;
      auVar3._12_4_ = 0x7fffffff;
      auVar8 = vandps_avx512vl(ZEXT416((uint)*pfVar5),auVar3);
      fVar9 = logf(auVar8._0_4_);
      local_7c = fVar9 + local_7c;
    }
    local_78._0_4_ = logf((float)local_78._0_4_);
    local_78._0_4_ = (float)local_78._0_4_ + local_7c;
    Eigen::PartialPivLU<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::~PartialPivLU(&local_58);
  }
  else {
    Eigen::LLT<Eigen::Matrix<float,-1,-1,0,-1,-1>,1>::
    LLT<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
              ((LLT<Eigen::Matrix<float,_1,_1,0,_1,_1>,1> *)&local_58,
               (EigenBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                *)M);
    local_60 = (MatrixTypeNested)
               Eigen::LLT<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1>::matrixL
                         ((LLT<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1> *)&local_58);
    local_78._0_4_ = 0.0;
    for (uVar7 = 0; uVar6 = (ulong)uVar7,
        (long)uVar6 <
        (M->
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        ).
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value; uVar7 = uVar7 + 1) {
      __x = Eigen::
            TriangularBase<Eigen::TriangularView<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1U>_>
            ::operator()((TriangularBase<Eigen::TriangularView<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1U>_>
                          *)&local_60,uVar6,uVar6);
      fVar9 = logf(__x);
      local_78._0_4_ = fVar9 + (float)local_78._0_4_;
    }
    local_78._0_4_ = (float)local_78._0_4_ + (float)local_78._0_4_;
    Eigen::internal::handmade_aligned_free
              (local_58.m_lu.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
               m_storage.m_data);
  }
  return (Scalar)local_78._0_4_;
}

Assistant:

inline typename MatrixType::Scalar logdet(const MatrixType& M, bool use_cholesky = false) {
  using namespace Eigen;
  using std::log;
  typedef typename MatrixType::Scalar Scalar;
  Scalar ld = 0;
  if (use_cholesky) {
    LLT<Matrix<Scalar,Dynamic,Dynamic>> chol(M);
    auto& U = chol.matrixL();
    for (unsigned i = 0; i < M.rows(); ++i)
      ld += log(U(i,i));
    ld *= 2;
  } else {
    PartialPivLU<Matrix<Scalar,Dynamic,Dynamic>> lu(M);
    auto& LU = lu.matrixLU();
    Scalar c = lu.permutationP().determinant(); // -1 or 1
    for (unsigned i = 0; i < LU.rows(); ++i) {
      const auto& lii = LU(i,i);
      if (lii < Scalar(0)) c *= -1;
      ld += log(abs(lii));
    }
    ld += log(c);
  }
  return ld;
}